

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

void __thiscall libchars::commands::auto_complete(commands *this)

{
  const_iterator cVar1;
  reference pbVar2;
  uint uVar3;
  int iVar4;
  debug *pdVar5;
  size_t sVar6;
  string *__x;
  size_type sVar7;
  reference pvVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  string *psVar12;
  long lVar13;
  _List_node_base *p_Var14;
  undefined8 uVar15;
  char *pcVar16;
  undefined8 uVar17;
  char *pcVar18;
  FILE *__stream;
  bool bVar19;
  double __x_00;
  double dVar20;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  bool local_3d1;
  bool local_2f3;
  byte local_2ca;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a0;
  iterator local_298;
  undefined1 local_290 [24];
  const_iterator si_1;
  size_t i_1;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  reference local_248;
  string *cmp_str;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  iterator local_230;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  const_iterator si;
  string prefix;
  size_t i;
  string *word_to_insert;
  value_type local_1e8;
  undefined1 local_1c8 [8];
  command_cursor cw;
  undefined1 local_138 [7];
  bool is_command;
  string_list_t options;
  undefined1 local_118 [8];
  string v_search;
  undefined1 local_f0 [7];
  bool available;
  command_cursor ci;
  token *local_58;
  token *T;
  string available_str;
  token *Tcur;
  size_t t_offset;
  commands *this_local;
  
  t_offset = (size_t)this;
  pdVar5 = debug::initialize(0);
  edit_object::length(&this->super_edit_object);
  debug::log(pdVar5,__x_00);
  do {
    uVar9 = (this->super_edit_object).insert_idx;
    sVar6 = edit_object::length(&this->super_edit_object);
    if (uVar9 < sVar6) {
      return;
    }
    Tcur = (token *)0x0;
    available_str.field_2._8_8_ = find_current_token(this,(size_t *)&Tcur);
    if ((token *)available_str.field_2._8_8_ == (token *)0x0) {
      pdVar5 = debug::initialize(0);
      debug::log(pdVar5,__x_01);
    }
    else {
      pdVar5 = debug::initialize(0);
      dVar20 = (double)std::__cxx11::string::c_str();
      debug::log(pdVar5,dVar20);
      if (Tcur < *(token **)(available_str.field_2._8_8_ + 0x80)) {
        return;
      }
      if ((*(uint *)(available_str.field_2._8_8_ + 0x6c) & 0x400) != 0) {
        return;
      }
    }
    std::__cxx11::string::string((string *)&T);
    local_58 = this->t_cmd;
    while( true ) {
      bVar19 = false;
      if (local_58 != (token *)0x0) {
        bVar19 = local_58->length != 0;
      }
      if (!bVar19) goto LAB_00129b7c;
      if (local_58 == (token *)available_str.field_2._8_8_) break;
      std::__cxx11::string::append((string *)&T);
      std::__cxx11::string::operator+=((string *)&T,' ');
      local_58 = local_58->next;
    }
    if (Tcur < *(token **)(available_str.field_2._8_8_ + 0x80)) {
      std::__cxx11::string::append((string *)&T,(ulong)local_58,0);
    }
    else {
      std::__cxx11::string::append((string *)&T);
    }
LAB_00129b7c:
    command_cursor::command_cursor((command_cursor *)local_f0,&this->root,0);
    local_58 = this->t_cmd;
    v_search.field_2._M_local_buf[0xf] = '\x01';
    while( true ) {
      local_2ca = 0;
      if (local_58 != (token *)0x0) {
        bVar19 = command_cursor::valid((command_cursor *)local_f0);
        local_2ca = 0;
        if (bVar19) {
          local_2ca = v_search.field_2._M_local_buf[0xf];
        }
      }
      if ((local_2ca & 1) == 0) break;
      pdVar5 = debug::initialize(0);
      dVar20 = (double)std::__cxx11::string::c_str();
      debug::log(pdVar5,dVar20);
      if (local_58 == (token *)available_str.field_2._8_8_) {
        if (Tcur == (token *)0x0) {
          v_search.field_2._M_local_buf[0xf] = '\0';
        }
        else {
          std::__cxx11::string::substr((ulong)local_118,(ulong)local_58);
          pdVar5 = debug::initialize(0);
          dVar20 = (double)std::__cxx11::string::c_str();
          debug::log(pdVar5,dVar20);
          v_search.field_2._M_local_buf[0xf] =
               command_cursor::find((command_cursor *)local_f0,(string *)local_118,this->mask,false)
          ;
          std::__cxx11::string::~string((string *)local_118);
        }
        local_58 = (token *)0x0;
      }
      else {
        v_search.field_2._M_local_buf[0xf] =
             command_cursor::find((command_cursor *)local_f0,&local_58->value,this->mask,false);
        local_2f3 = false;
        if ((bool)v_search.field_2._M_local_buf[0xf]) {
          local_2f3 = command_cursor::next_root((command_cursor *)local_f0);
        }
        v_search.field_2._M_local_buf[0xf] = local_2f3;
        local_58 = local_58->next;
      }
    }
    pdVar5 = debug::initialize(0);
    command_cursor::current((command_cursor *)local_f0);
    command_cursor::current_idx((command_cursor *)local_f0);
    command_cursor::word_abi_cxx11_((command_cursor *)local_f0);
    dVar20 = (double)std::__cxx11::string::c_str();
    debug::log(pdVar5,dVar20);
    bVar19 = command_cursor::valid((command_cursor *)local_f0);
    if (bVar19) {
      pdVar5 = debug::initialize(0);
      command_cursor::current((command_cursor *)local_f0);
      dVar20 = (double)std::__cxx11::string::c_str();
      debug::log(pdVar5,dVar20);
    }
    if ((v_search.field_2._M_local_buf[0xf] & 1U) == 0) {
      pdVar5 = debug::initialize(0);
      debug::log(pdVar5,__x_02);
      options.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size._4_4_ = 1;
    }
    else {
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_138);
      cw.idx._7_1_ = 0;
      pdVar5 = debug::initialize(0);
      command_cursor::word_abi_cxx11_((command_cursor *)local_f0);
      dVar20 = (double)std::__cxx11::string::c_str();
      debug::log(pdVar5,dVar20);
      command_cursor::command_cursor((command_cursor *)local_1c8,(command_cursor *)local_f0);
      while (bVar19 = command_cursor::next((command_cursor *)local_1c8), bVar19) {
        command_cursor::word_abi_cxx11_((command_cursor *)local_1c8);
        uVar9 = std::__cxx11::string::empty();
        if ((((uVar9 & 1) == 0) &&
            (bVar19 = command_cursor::end((command_cursor *)local_1c8), bVar19)) &&
           ((bVar19 = command_cursor::command((command_cursor *)local_1c8,this->mask,false), bVar19
            || (bVar19 = command_cursor::subword((command_cursor *)local_1c8,this->mask,false),
               bVar19)))) {
          pdVar5 = debug::initialize(0);
          command_cursor::word_abi_cxx11_((command_cursor *)local_f0);
          std::__cxx11::string::c_str();
          command_cursor::word_abi_cxx11_((command_cursor *)local_1c8);
          dVar20 = (double)std::__cxx11::string::c_str();
          debug::log(pdVar5,dVar20);
          __x = command_cursor::word_abi_cxx11_((command_cursor *)local_1c8);
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_138,__x);
          cw.idx._7_1_ = command_cursor::command((command_cursor *)local_1c8,this->mask,false);
        }
      }
      bVar19 = std::__cxx11::
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_138);
      if (((!bVar19) && (bVar19 = command_cursor::end((command_cursor *)local_f0), bVar19)) &&
         ((bVar19 = command_cursor::command((command_cursor *)local_f0,this->mask,false), bVar19 ||
          (bVar19 = command_cursor::subword((command_cursor *)local_f0,this->mask,false), bVar19))))
      {
        pdVar5 = debug::initialize(0);
        debug::log(pdVar5,__x_03);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e8,"",(allocator<char> *)((long)&word_to_insert + 7));
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_138,&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&word_to_insert + 7));
      }
      bVar19 = std::__cxx11::
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_138);
      if (bVar19) {
        command_cursor::word_abi_cxx11_((command_cursor *)local_f0);
        uVar9 = std::__cxx11::string::empty();
        if (((uVar9 & 1) == 0) && (bVar19 = command_cursor::end((command_cursor *)local_f0), bVar19)
           ) {
          pdVar5 = debug::initialize(0);
          debug::log(pdVar5,__x_04);
          (*(this->super_edit_object)._vptr_edit_object[4])(this,0x20);
LAB_0012aa15:
          options.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size._4_4_ = 0;
        }
        else {
          options.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size._4_4_ = 1;
        }
      }
      else {
        sVar7 = std::__cxx11::
                list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_138);
        if (sVar7 == 1) {
          pdVar5 = debug::initialize(0);
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_138);
          dVar20 = (double)std::__cxx11::string::c_str();
          debug::log(pdVar5,dVar20);
          pvVar8 = std::__cxx11::
                   list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_138);
          prefix.field_2._8_8_ = 0;
          while (uVar9 = std::__cxx11::string::size(), (ulong)prefix.field_2._8_8_ < uVar9) {
            prefix.field_2._8_8_ = prefix.field_2._8_8_ + 1;
            pcVar10 = (char *)std::__cxx11::string::at((ulong)pvVar8);
            (*(this->super_edit_object)._vptr_edit_object[4])(this,(ulong)(uint)(int)*pcVar10);
          }
          parse(this);
          if ((cw.idx._7_1_ & 1) == 0) goto LAB_0012aa15;
          options.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size._4_4_ = 1;
        }
        else {
          pvVar8 = std::__cxx11::
                   list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_138);
          std::__cxx11::string::string((string *)&si,(string *)pvVar8);
          local_230._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_138);
          std::
          _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_List_const_iterator(&local_228,&local_230);
          std::
          _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_228);
          while( true ) {
            uVar3 = std::__cxx11::string::empty();
            local_3d1 = false;
            if ((uVar3 & 1) == 0) {
              cmp_str = (string *)
                        std::__cxx11::
                        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_138);
              std::
              _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_List_const_iterator(&local_238,(iterator *)&cmp_str);
              local_3d1 = std::operator!=(&local_228,&local_238);
            }
            if (local_3d1 == false) break;
            local_250._M_node =
                 (_List_node_base *)
                 std::
                 _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&local_228,0);
            local_248 = std::
                        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*(&local_250);
            uVar9 = std::__cxx11::string::length();
            uVar11 = std::__cxx11::string::length();
            if (uVar9 < uVar11) {
              std::__cxx11::string::length();
              std::__cxx11::string::substr((ulong)&i_1,(ulong)&si);
              std::__cxx11::string::operator=((string *)&si,(string *)&i_1);
              std::__cxx11::string::~string((string *)&i_1);
            }
            while( true ) {
              uVar3 = std::__cxx11::string::empty();
              pbVar2 = local_248;
              bVar19 = false;
              if ((uVar3 & 1) == 0) {
                psVar12 = (string *)std::__cxx11::string::length();
                iVar4 = std::__cxx11::string::compare((ulong)pbVar2,0,psVar12);
                bVar19 = iVar4 != 0;
              }
              if (!bVar19) break;
              lVar13 = std::__cxx11::string::length();
              std::__cxx11::string::erase((ulong)&si,lVar13 - 1);
            }
          }
          uVar9 = std::__cxx11::string::empty();
          if ((uVar9 & 1) == 0) {
            si_1._M_node = (_List_node_base *)0x0;
            while (cVar1._M_node = si_1._M_node,
                  p_Var14 = (_List_node_base *)std::__cxx11::string::size(), cVar1._M_node < p_Var14
                  ) {
              si_1._M_node = (_List_node_base *)((long)&(si_1._M_node)->_M_next + 1);
              pcVar10 = (char *)std::__cxx11::string::at((ulong)&si);
              (*(this->super_edit_object)._vptr_edit_object[4])(this,(ulong)(uint)(int)*pcVar10);
            }
            parse(this);
          }
          else {
            printf("\n");
            local_290._8_8_ =
                 std::__cxx11::
                 list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_138);
            std::
            _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_List_const_iterator
                      ((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_290 + 0x10),(iterator *)(local_290 + 8));
            while( true ) {
              local_298._M_node =
                   (_List_node_base *)
                   std::__cxx11::
                   list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_138);
              std::
              _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_List_const_iterator
                        ((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_290,&local_298);
              __stream = (FILE *)local_290;
              bVar19 = std::operator!=((_Self *)(local_290 + 0x10),(_Self *)__stream);
              if (!bVar19) break;
              pcVar10 = color_str(this,COLOR_NORMAL);
              uVar15 = std::__cxx11::string::c_str();
              pcVar16 = color_str(this,COLOR_COMPLETION);
              local_2a0._M_node =
                   (_List_node_base *)
                   std::
                   _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator++((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)(local_290 + 0x10),0);
              std::
              _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator->(&local_2a0);
              uVar17 = std::__cxx11::string::c_str();
              pcVar18 = color_str(this,COLOR_NORMAL);
              printf("%s%s%s%s%s\n",pcVar10,uVar15,pcVar16,uVar17,pcVar18);
            }
            edit_object::rewind(&this->super_edit_object,__stream);
          }
          options.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size._4_4_ = 1;
          std::__cxx11::string::~string((string *)&si);
        }
      }
      command_cursor::~command_cursor((command_cursor *)local_1c8);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_138);
    }
    command_cursor::~command_cursor((command_cursor *)local_f0);
    std::__cxx11::string::~string((string *)&T);
    if (options.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node._M_size._4_4_ != 0) {
      return;
    }
  } while( true );
}

Assistant:

void commands::auto_complete()
    {
        LC_LOG_VERBOSE("complete@%zu/%zu",insert_idx,length());

        // only allowed at end of line + on command tokens (no quotes)
        while (insert_idx >= length()) {
            // sanity check on position in line + type of token
            size_t t_offset = 0;
            token *Tcur = find_current_token(t_offset);
            if (Tcur != NULL) {
                LC_LOG_VERBOSE("current token [%p/%s@%zu+%zu] @ %zu",Tcur,Tcur->value.c_str(),Tcur->offset,Tcur->length,t_offset);
                if (t_offset < Tcur->length || (Tcur->status & token::IS_QUOTED))
                    return;
            }
            else {
                LC_LOG_VERBOSE("** no current token **");
            }

            std::string available_str;
            token *T = t_cmd;
            while (T != NULL && T->length > 0) {
                if (T == Tcur) {
                    if (t_offset < Tcur->length) {
                        available_str.append(T->value, 0, t_offset);
                    }
                    else {
                        available_str.append(T->value);
                    }
                    break;
                }
                else {
                    available_str.append(T->value);
                    available_str += ' ';
                }
                T = T->next;
            }

            // find current position in command dictionary
            command_cursor ci(&root);
            T = t_cmd;
            bool available = true;
            while (T != NULL && ci.valid() && available) {
                LC_LOG_VERBOSE("search token [%p/%s@%zu+%zu]",T,T->value.c_str(),T->offset,T->length);
                if (T == Tcur) {
                    if (t_offset > 0) {
                        std::string v_search = T->value.substr(0,t_offset);
                        LC_LOG_VERBOSE("offset[%zu]; search for [%s]",t_offset,v_search.c_str());
                        available = ci.find(v_search,mask);
                    }
                    else {
                        available = false;
                    }
                    T = NULL;
                }
                else {
                    available = ci.find(T->value,mask);
                    available = available && ci.next_root();
                    T = T->next;
                }
            }

            LC_LOG_DEBUG("cursor: %p @ %zu: [%s]", ci.current(), ci.current_idx(), ci.word().c_str());
            if (ci.valid())
                LC_LOG_VERBOSE("dictionary option: [%s]",ci.current()->part.c_str());

            if (!available) {
                LC_LOG_DEBUG("** no options available **");
                return;
            }

            // collect combinations (full words + words with sub-words + words with valid commands)
            typedef std::list<std::string> string_list_t;
            string_list_t options;
            bool is_command = false;
            LC_LOG_VERBOSE("current partial word: [%s]",ci.word().c_str());
            command_cursor cw(ci);
            while (cw.next()) {
                if (!cw.word().empty() && cw.end() && (cw.command(mask) || cw.subword(mask))) {
                    LC_LOG_VERBOSE("options += %s[%s]", ci.word().c_str(), cw.word().c_str());
                    options.push_back(cw.word());
                    is_command = cw.command(mask);
                }
            }
            if (!options.empty() && ci.end() && (ci.command(mask) || ci.subword(mask))) {
                LC_LOG_VERBOSE("options += <cr>");
                options.push_back("");
            }

            if (options.empty()) {
                if (!ci.word().empty() && ci.end()) {
                    // end-of-word --> add space
                    LC_LOG_DEBUG("insert space");
                    insert(' ');
                    // no need to reparse because whitespace does not change token list
                }
                else {
                    return;
                }
            }
            else if (options.size() == 1) {
                // middle-of-word --> complete word (take first option)
                // line empty / after whitespace + 1 path --> add word
                LC_LOG_DEBUG("insert(middle/empty) [%s]",options.front().c_str());
                const std::string &word_to_insert = options.front();
                size_t i = 0;
                while (i < word_to_insert.size())
                    insert(word_to_insert.at(i++));
                // reparse before next iteration of loop
                parse();
                // stop auto-complete if new string is a valid command
                if (is_command)
                    return;
            }
            else {
                // 2+ options --> find longest common prefix amongst options
                std::string prefix = options.front();
                string_list_t::const_iterator si = options.begin();
                ++si;
                while (!prefix.empty() && si != options.end()) {
                    const std::string &cmp_str = *si++;
                    if (cmp_str.length() < prefix.length())
                        prefix = prefix.substr(0,cmp_str.length());
                    while (!prefix.empty() && cmp_str.compare(0,prefix.length(),prefix) != 0)
                        prefix.erase(prefix.length() - 1);
                }

                if (!prefix.empty()) {
                    // common prefix available --> add prefix
                    size_t i = 0;
                    while (i < prefix.size())
                        insert(prefix.at(i++));
                    // reparse before next iteration of loop
                    parse();
                }
                else {
                    // dump available options
                    printf("\n");
                    string_list_t::const_iterator si = options.begin();
                    while (si != options.end()) {
                        printf("%s%s%s%s%s\n",
                            color_str(COLOR_NORMAL),
                            available_str.c_str(),
                            color_str(COLOR_COMPLETION),
                            (si++)->c_str(),
                            color_str(COLOR_NORMAL));
                    }
                    rewind();
                }
                return;
            }
        }
    }